

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpnint.h
# Opt level: O1

CTcPrsNode * __thiscall CTPNUnaryBase::adjust_for_dyn(CTPNUnaryBase *this,tcpn_dyncomp_info *info)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (info->speculative != 0) {
    iVar1 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1b])(this);
    if (iVar1 != 0) {
      err_throw(0x9c5);
    }
  }
  iVar1 = (*(this->sub_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])(this->sub_,info);
  this->sub_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  return &this->super_CTcPrsNode;
}

Assistant:

class CTcPrsNode *adjust_for_dyn(const tcpn_dyncomp_info *info)
    {
        /* 
         *   if this expression has side effects, don't allow it to be
         *   evaluated speculatively 
         */
        if (info->speculative && has_side_effects())
            err_throw(VMERR_BAD_SPEC_EVAL);
        
        /* adjust my subexpression */
        sub_ = sub_->adjust_for_dyn(info);

        /* return myself otherwise unchanged */
        return this;
    }